

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

uint64_t sbox_layer_10_bitsliced_uint64(uint64_t in)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  uint64_t x2m;
  uint64_t x1s;
  uint64_t x0s;
  uint64_t in_local;
  
  uVar1 = (in & 0x2492492400000000) << 2;
  uVar2 = (in & 0x4924924800000000) << 1;
  uVar3 = in & 0x9249249000000000;
  return in & 0x3ffffffff ^ (uVar2 & uVar3 ^ uVar1) >> 2 ^ (uVar1 & uVar3 ^ uVar1 ^ uVar2) >> 1 ^
         uVar1 & uVar2 ^ uVar1 ^ uVar2 ^ uVar3;
}

Assistant:

static inline uint64_t sbox_layer_10_bitsliced_uint64(uint64_t in) {
  // a, b, c
  const uint64_t x0s = (in & MASK_X0I) << 2;
  const uint64_t x1s = (in & MASK_X1I) << 1;
  const uint64_t x2m = in & MASK_X2I;

  // (b & c) ^ a
  const uint64_t t0 = (x1s & x2m) ^ x0s;
  // (c & a) ^ a ^ b
  const uint64_t t1 = (x0s & x2m) ^ x0s ^ x1s;
  // (a & b) ^ a ^ b ^c
  const uint64_t t2 = (x0s & x1s) ^ x0s ^ x1s ^ x2m;

  return (in & MASK_MASK) ^ (t0 >> 2) ^ (t1 >> 1) ^ t2;
}